

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O3

void __thiscall
asio::detail::reactive_socket_service_base::
start_connect_op<asio::detail::reactive_socket_connect_op<std::function<void(std::error_code_const&)>,asio::any_io_executor>>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
          *op,bool is_continuation,void *addr,size_t addrlen,void *param_6,
          enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_connect_op<function<void_(const_error_code_&)>,_any_io_executor>::handler_type,_typename_reactive_socket_connect_op<function<void_(const_error_code_&)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
          *param_7)

{
  error_code *this_00;
  atomic_count *paVar1;
  reactor *prVar2;
  per_descriptor_data pdVar3;
  reactor *prVar4;
  reactor_op *prVar5;
  bool bVar6;
  int iVar7;
  error_category *peVar8;
  per_descriptor_data pdVar9;
  reactor_op *prVar10;
  error_code local_50;
  error_code local_40;
  
  prVar2 = this->reactor_;
  if (((impl->state_ & 3) == 0) &&
     (bVar6 = socket_ops::set_internal_non_blocking
                        (impl->socket_,&impl->state_,true,
                         &(op->super_reactive_socket_connect_op_base).super_reactor_op.ec_), !bVar6)
     ) {
LAB_003fe28a:
    scheduler::post_immediate_completion(prVar2->scheduler_,(operation *)op,is_continuation);
    return;
  }
  this_00 = &(op->super_reactive_socket_connect_op_base).super_reactor_op.ec_;
  iVar7 = socket_ops::connect((socket_ops *)(ulong)(uint)impl->socket_,(int)addr,(sockaddr *)addrlen
                              ,(socklen_t)this_00);
  if ((iVar7 == 0) ||
     (((std::error_code::error_code<asio::error::basic_errors,void>(&local_50,in_progress),
       (op->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_cat !=
       (error_category *)CONCAT44(local_50._M_cat._4_4_,local_50._M_cat._0_4_) ||
       ((op->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_value !=
        local_50._M_value)) &&
      ((std::error_code::error_code<asio::error::basic_errors,void>(&local_40,try_again),
       (op->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_cat != local_40._M_cat ||
       ((op->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_value !=
        local_40._M_value)))))) goto LAB_003fe28a;
  peVar8 = (error_category *)std::_V2::system_category();
  (op->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_value = 0;
  (op->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_cat = peVar8;
  pdVar3 = impl->reactor_data_;
  if (pdVar3 == (per_descriptor_data)0x0) {
    std::error_code::operator=(this_00,bad_descriptor);
    goto LAB_003fe28a;
  }
  prVar4 = this->reactor_;
  iVar7 = impl->socket_;
  bVar6 = (pdVar3->mutex_).enabled_;
  pdVar9 = pdVar3;
  if (bVar6 == true) {
    pthread_mutex_lock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
    pdVar9 = impl->reactor_data_;
  }
  if (pdVar9->shutdown_ == false) {
    if (pdVar9->op_queue_[1].front_ == (reactor_op *)0x0) {
      if (pdVar9->registered_events_ == 0) {
        std::error_code::operator=(this_00,operation_not_supported);
        goto LAB_003fe262;
      }
      local_50._M_value = pdVar9->registered_events_ | 4;
      pdVar9->registered_events_ = local_50._M_value;
      local_50._4_4_ = SUB84(pdVar9,0);
      local_50._M_cat._0_4_ = (undefined4)((ulong)pdVar9 >> 0x20);
      epoll_ctl(prVar4->epoll_fd_,3,iVar7,(epoll_event *)&local_50);
      pdVar9 = impl->reactor_data_;
    }
    (op->super_reactive_socket_connect_op_base).super_reactor_op.super_operation.next_ =
         (scheduler_operation *)0x0;
    prVar5 = pdVar9->op_queue_[1].back_;
    prVar10 = (reactor_op *)(pdVar9->op_queue_ + 1);
    if (prVar5 != (reactor_op *)0x0) {
      prVar10 = prVar5;
    }
    (prVar10->super_operation).next_ = (scheduler_operation *)op;
    pdVar9->op_queue_[1].back_ = (reactor_op *)op;
    LOCK();
    paVar1 = &prVar4->scheduler_->outstanding_work_;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  else {
LAB_003fe262:
    scheduler::post_immediate_completion(prVar2->scheduler_,(operation *)op,is_continuation);
  }
  if (bVar6 == false) {
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
  return;
}

Assistant:

void start_connect_op(base_implementation_type& impl, Op* op,
      bool is_continuation, const void* addr, size_t addrlen, const void*,
      enable_if_t<
        is_same<
          typename associated_immediate_executor<
            typename Op::handler_type,
            typename Op::io_executor_type
          >::asio_associated_immediate_executor_is_unspecialised,
          void
        >::value
      >*)
  {
    return do_start_connect_op(impl, op, is_continuation, addr,
        addrlen, &reactor::call_post_immediate_completion, &reactor_);
  }